

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_MON_TIMED_INC(effect_handler_context_t_conflict *context)

{
  wchar_t timer;
  monster *mon;
  
  if ((context->origin).what == SRC_MONSTER) {
    timer = effect_calculate_value(context,false);
    mon = cave_monster(cave,(context->origin).which.monster);
    if (mon != (monster *)0x0) {
      if (timer < L'\x01') {
        timer = L'\0';
      }
      mon_inc_timed(mon,context->subtype,timer,L'\0');
      context->ident = true;
    }
    return true;
  }
  __assert_fail("context->origin.what == SRC_MONSTER",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effect-handler-general.c"
                ,0x29c,"_Bool effect_handler_MON_TIMED_INC(effect_handler_context_t *)");
}

Assistant:

bool effect_handler_MON_TIMED_INC(effect_handler_context_t *context)
{
	assert(context->origin.what == SRC_MONSTER);

	int amount = effect_calculate_value(context, false);
	struct monster *mon = cave_monster(cave, context->origin.which.monster);

	if (mon) {
		mon_inc_timed(mon, context->subtype, MAX(amount, 0), 0);
		context->ident = true;
	}

	return true;
}